

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

void __thiscall cmCTestCurlOpts::cmCTestCurlOpts(cmCTestCurlOpts *this,cmCTest *ctest)

{
  bool bVar1;
  _Optional_payload_base<int> _Var2;
  char *extraout_RDX;
  string *arg;
  pointer __lhs;
  string_view value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view tls_version;
  allocator<char> local_a1;
  string local_a0;
  string tlsVerify;
  string local_60;
  cmList args;
  
  (this->TLSVersionOpt).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  *(undefined2 *)
   &(this->TLSVerifyOpt).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool>._M_engaged = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"TLSVersion",(allocator<char> *)&local_60);
  cmCTest::GetCTestConfiguration(&tlsVerify,ctest,&local_a0);
  tls_version._M_str = tlsVerify._M_dataplus._M_p;
  tls_version._M_len = tlsVerify._M_string_length;
  _Var2 = (_Optional_payload_base<int>)cmCurlParseTLSVersion(tls_version);
  (this->TLSVersionOpt).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var2;
  std::__cxx11::string::~string((string *)&tlsVerify);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"TLSVerify",(allocator<char> *)&local_60);
  cmCTest::GetCTestConfiguration(&tlsVerify,ctest,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (tlsVerify._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"CurlOptions",&local_a1);
    cmCTest::GetCTestConfiguration(&local_a0,ctest,&local_60);
    init._M_len = 1;
    init._M_array = &local_a0;
    cmList::cmList(&args,init);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    for (__lhs = args.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != args.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      bVar1 = std::operator==(__lhs,"CURLOPT_SSL_VERIFYPEER_OFF");
      if (bVar1) {
        (this->TLSVerifyOpt).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
      }
      bVar1 = std::operator==(__lhs,"CURLOPT_SSL_VERIFYHOST_OFF");
      if (bVar1) {
        this->VerifyHostOff = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args.Values);
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)tlsVerify._M_dataplus._M_p;
    bVar1 = cmValue::IsOn((cmValue *)tlsVerify._M_string_length,value);
    (this->TLSVerifyOpt).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)(bVar1 | 0x100);
  }
  std::__cxx11::string::~string((string *)&tlsVerify);
  return;
}

Assistant:

cmCTestCurlOpts::cmCTestCurlOpts(cmCTest* ctest)
{
  this->TLSVersionOpt =
    cmCurlParseTLSVersion(ctest->GetCTestConfiguration("TLSVersion"));

  std::string tlsVerify = ctest->GetCTestConfiguration("TLSVerify");
  if (!tlsVerify.empty()) {
    this->TLSVerifyOpt = cmIsOn(tlsVerify);
  } else {
    cmList args{ ctest->GetCTestConfiguration("CurlOptions") };
    for (std::string const& arg : args) {
      if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
        this->TLSVerifyOpt = false;
      }
      if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
        this->VerifyHostOff = true;
      }
    }
  }
}